

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void gl4cts::EnhancedLayouts::Utils::Program::Uniform
               (Functions *gl,Type *type,GLsizei count,GLint location,GLvoid *data)

{
  GLenum GVar1;
  TestError *pTVar2;
  uniformNdv p_Var3;
  uniformMatrixNdv p_Var4;
  uniformNfv p_Var5;
  uniformMatrixNfv p_Var6;
  uniformNiv p_Var7;
  uniformNuiv p_Var8;
  GLvoid *data_local;
  GLint location_local;
  GLsizei count_local;
  Type *type_local;
  Functions *gl_local;
  
  if (location != -1) {
    switch(type->m_basic_type) {
    case Float:
      if (type->m_n_columns == 1) {
        p_Var5 = getUniformNfv(gl,type->m_n_rows);
        (*p_Var5)(location,count,(GLfloat *)data);
        GVar1 = (*gl->getError)();
        glu::checkError(GVar1,"UniformNfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xbae);
      }
      else {
        p_Var6 = getUniformMatrixNfv(gl,type->m_n_columns,type->m_n_rows);
        (*p_Var6)(location,count,'\0',(GLfloat *)data);
        GVar1 = (*gl->getError)();
        glu::checkError(GVar1,"UniformMatrixNfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xbb3);
      }
      break;
    case Double:
      if (type->m_n_columns == 1) {
        p_Var3 = getUniformNdv(gl,type->m_n_rows);
        (*p_Var3)(location,count,(GLdouble *)data);
        GVar1 = (*gl->getError)();
        glu::checkError(GVar1,"UniformNdv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xba2);
      }
      else {
        p_Var4 = getUniformMatrixNdv(gl,type->m_n_columns,type->m_n_rows);
        (*p_Var4)(location,count,'\0',(GLdouble *)data);
        GVar1 = (*gl->getError)();
        glu::checkError(GVar1,"UniformMatrixNdv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                        ,0xba7);
      }
      break;
    case Int:
      p_Var7 = getUniformNiv(gl,type->m_n_rows);
      (*p_Var7)(location,count,(GLint *)data);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"UniformNiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,3000);
      break;
    case Uint:
      p_Var8 = getUniformNuiv(gl,type->m_n_rows);
      (*p_Var8)(location,count,(GLuint *)data);
      GVar1 = (*gl->getError)();
      glu::checkError(GVar1,"UniformNuiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                      ,0xbbc);
      break;
    default:
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0xbbf);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    return;
  }
  pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar2,"Uniform is inactive",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0xb99);
  __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void Program::Uniform(const Functions& gl, const Type& type, GLsizei count, GLint location, const GLvoid* data)
{
	if (-1 == location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	switch (type.m_basic_type)
	{
	case Type::Double:
		if (1 == type.m_n_columns)
		{
			getUniformNdv(gl, type.m_n_rows)(location, count, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNdv");
		}
		else
		{
			getUniformMatrixNdv(gl, type.m_n_columns, type.m_n_rows)(location, count, false, (const GLdouble*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNdv");
		}
		break;
	case Type::Float:
		if (1 == type.m_n_columns)
		{
			getUniformNfv(gl, type.m_n_rows)(location, count, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNfv");
		}
		else
		{
			getUniformMatrixNfv(gl, type.m_n_columns, type.m_n_rows)(location, count, false, (const GLfloat*)data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UniformMatrixNfv");
		}
		break;
	case Type::Int:
		getUniformNiv(gl, type.m_n_rows)(location, count, (const GLint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNiv");
		break;
	case Type::Uint:
		getUniformNuiv(gl, type.m_n_rows)(location, count, (const GLuint*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformNuiv");
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}